

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
::Iterator::Equals(Iterator *this,
                  ParamIteratorInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
                  *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  long lVar5;
  GTestLog local_20;
  GTestLog local_1c;
  
  iVar2 = (*(this->
            super_ParamIteratorInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
            )._vptr_ParamIteratorInterface[2])();
  iVar3 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_20,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x15a);
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    poVar4 = std::operator<<(poVar4,"from different generators.");
    std::endl<char,std::char_traits<char>>(poVar4);
    GTestLog::~GTestLog(&local_20);
  }
  lVar5 = __dynamic_cast(other,&ParamIteratorInterface<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase*(*)()>
                                ::typeinfo,
                         &ValuesInIteratorRangeGenerator<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase*(*)()>
                          ::Iterator::typeinfo,0);
  bVar1 = IsTrue(lVar5 != 0);
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x4aa);
    std::operator<<((ostream *)&std::cerr,
                    "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ")
    ;
    GTestLog::~GTestLog(&local_1c);
  }
  return (this->iterator_)._M_current ==
         (_func_DescriptorDatabaseTestCase_ptr **)other[2]._vptr_ParamIteratorInterface;
}

Assistant:

bool Equals(const ParamIteratorInterface<T>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      return iterator_ ==
             CheckedDowncastToActualType<const Iterator>(&other)->iterator_;
    }